

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

void __thiscall QHttpNetworkReply::setDownstreamLimited(QHttpNetworkReply *this,bool dsl)

{
  byte bVar1;
  QHttpNetworkReplyPrivate *reply;
  byte in_SIL;
  QHttpNetworkReplyPrivate *d;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  reply = d_func((QHttpNetworkReply *)0x304885);
  reply->downstreamLimited = (bool)(bVar1 & 1);
  QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x3048ad);
  QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x3048b5);
  QHttpNetworkConnectionPrivate::readMoreLater
            ((QHttpNetworkConnectionPrivate *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
             (QHttpNetworkReply *)reply);
  return;
}

Assistant:

void QHttpNetworkReply::setDownstreamLimited(bool dsl)
{
    Q_D(QHttpNetworkReply);
    d->downstreamLimited = dsl;
    d->connection->d_func()->readMoreLater(this);
}